

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.cc
# Opt level: O2

optional<unsigned_long> __thiscall bloaty::dwarf::AttrValue::ToUint(AttrValue *this,CU *cu)

{
  ulong in_RAX;
  _Storage<unsigned_long,_true> _Var1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar2;
  optional<unsigned_long> oVar3;
  optional<unsigned_long> oVar4;
  string_view str;
  string_view local_10;
  
  if (this->form_ == 0x21) {
    oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._8_8_ = 0;
    oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload = (_Storage<unsigned_long,_true>)in_RAX;
    return (optional<unsigned_long>)
           oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>;
  }
  if ((this->type_ & ~kUnresolvedUint) == kUint) {
    _Var1._M_value = GetUint(this,cu);
    uVar2 = extraout_RDX_00;
  }
  else {
    local_10 = GetString(this,cu);
    uVar2 = 0;
    _Var1._M_value = local_10._M_len - 1;
    switch(_Var1._M_value) {
    case 0:
    case 1:
      _Var1._0_1_ = ReadFixed<unsigned_char,1ul>(&local_10);
      _Var1._M_value._1_7_ = 0;
      uVar2 = extraout_RDX;
      break;
    default:
      goto switchD_001a09db_caseD_2;
    case 3:
      _Var1._0_4_ = ReadFixed<unsigned_int,4ul>(&local_10);
      _Var1._M_value._4_4_ = 0;
      uVar2 = extraout_RDX_01;
      break;
    case 7:
      _Var1._M_value = ReadFixed<unsigned_long,8ul>(&local_10);
      uVar2 = extraout_RDX_02;
    }
  }
  uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
switchD_001a09db_caseD_2:
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar2;
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = _Var1._M_value;
  return (optional<unsigned_long>)
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

absl::optional<uint64_t> AttrValue::ToUint(const CU& cu) const {
  if (form_ == DW_FORM_implicit_const) {
    // DW_FORM_implicit_const value is stored in AbbrevTable, but
    // we don't keep it in AttrValue (discarded in AbbrevTable::ReadAbbrevs()).
    // return absl::nullopt to make sure the value is not available.
    return absl::nullopt;
  }
  if (IsUint()) return GetUint(cu);
  string_view str = GetString(cu);
  switch (str.size()) {
    case 1:
      return ReadFixed<uint8_t>(&str);
    case 2:
      return ReadFixed<uint8_t>(&str);
    case 4:
      return ReadFixed<uint32_t>(&str);
    case 8:
      return ReadFixed<uint64_t>(&str);
  }
  return absl::nullopt;
}